

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * __thiscall
pugi::impl::anon_unknown_0::xml_parser::parse_doctype_primitive(xml_parser *this,char_t *s)

{
  bool bVar1;
  char *pcStack_20;
  char_t ch;
  char_t *s_local;
  xml_parser *this_local;
  
  if ((*s == '\"') || (*s == '\'')) {
    pcStack_20 = s + 1;
    while( true ) {
      bVar1 = false;
      if (*pcStack_20 != '\0') {
        bVar1 = *pcStack_20 != *s;
      }
      if (!bVar1) break;
      pcStack_20 = pcStack_20 + 1;
    }
    if (*pcStack_20 == '\0') {
      this->error_offset = pcStack_20;
      this->error_status = status_bad_doctype;
      return (char_t *)0x0;
    }
    pcStack_20 = pcStack_20 + 1;
  }
  else if ((*s == '<') && (s[1] == '?')) {
    pcStack_20 = s + 2;
    while( true ) {
      bVar1 = false;
      if (*pcStack_20 != '\0') {
        bVar1 = false;
        if (*pcStack_20 == '?') {
          bVar1 = pcStack_20[1] == '>';
        }
        bVar1 = (bool)(bVar1 ^ 1);
      }
      if (!bVar1) break;
      pcStack_20 = pcStack_20 + 1;
    }
    if (*pcStack_20 == '\0') {
      this->error_offset = pcStack_20;
      this->error_status = status_bad_doctype;
      return (char_t *)0x0;
    }
    pcStack_20 = pcStack_20 + 2;
  }
  else {
    if ((*s != '<') || (((s[1] != '!' || (s[2] != '-')) || (s[3] != '-')))) {
      this->error_offset = s;
      this->error_status = status_bad_doctype;
      return (char_t *)0x0;
    }
    pcStack_20 = s + 4;
    while( true ) {
      bVar1 = false;
      if (*pcStack_20 != '\0') {
        bVar1 = false;
        if ((*pcStack_20 == '-') && (bVar1 = false, pcStack_20[1] == '-')) {
          bVar1 = pcStack_20[2] == '>';
        }
        bVar1 = (bool)(bVar1 ^ 1);
      }
      if (!bVar1) break;
      pcStack_20 = pcStack_20 + 1;
    }
    if (*pcStack_20 == '\0') {
      this->error_offset = pcStack_20;
      this->error_status = status_bad_doctype;
      return (char_t *)0x0;
    }
    pcStack_20 = pcStack_20 + 3;
  }
  return pcStack_20;
}

Assistant:

char_t* parse_doctype_primitive(char_t* s)
		{
			if (*s == '"' || *s == '\'')
			{
				// quoted string
				char_t ch = *s++;
				PUGI__SCANFOR(*s == ch);
				if (!*s) PUGI__THROW_ERROR(status_bad_doctype, s);

				s++;
			}
			else if (s[0] == '<' && s[1] == '?')
			{
				// <? ... ?>
				s += 2;
				PUGI__SCANFOR(s[0] == '?' && s[1] == '>'); // no need for ENDSWITH because ?> can't terminate proper doctype
				if (!*s) PUGI__THROW_ERROR(status_bad_doctype, s);

				s += 2;
			}
			else if (s[0] == '<' && s[1] == '!' && s[2] == '-' && s[3] == '-')
			{
				s += 4;
				PUGI__SCANFOR(s[0] == '-' && s[1] == '-' && s[2] == '>'); // no need for ENDSWITH because --> can't terminate proper doctype
				if (!*s) PUGI__THROW_ERROR(status_bad_doctype, s);

				s += 3;
			}
			else PUGI__THROW_ERROR(status_bad_doctype, s);

			return s;
		}